

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cc
# Opt level: O0

feature * VW::get_features(vw *all,example *ec,size_t *feature_map_len)

{
  uint32_t uVar1;
  features_and_source *dat;
  size_t sVar2;
  feature **ppfVar3;
  size_t *in_RDX;
  features_and_source fs;
  parameters *in_stack_ffffffffffffff88;
  example *in_stack_ffffffffffffff98;
  vw *in_stack_ffffffffffffffa0;
  v_array<feature> local_48;
  uint32_t local_28;
  ulong local_20;
  size_t *local_18;
  
  local_18 = in_RDX;
  local_28 = parameters::stride_shift(in_stack_ffffffffffffff88);
  dat = (features_and_source *)parameters::mask(in_stack_ffffffffffffff88);
  uVar1 = parameters::stride_shift(in_stack_ffffffffffffff88);
  local_20 = (ulong)dat >> ((byte)uVar1 & 0x3f);
  v_init<feature>();
  GD::foreach_feature<features_and_source,_unsigned_long,_&vec_store>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,dat);
  sVar2 = v_array<feature>::size(&local_48);
  *local_18 = sVar2;
  ppfVar3 = v_array<feature>::begin(&local_48);
  return *ppfVar3;
}

Assistant:

feature* get_features(vw& all, example* ec, size_t& feature_map_len)
{
  features_and_source fs;
  fs.stride_shift = all.weights.stride_shift();
  fs.mask = (uint64_t)all.weights.mask() >> all.weights.stride_shift();
  fs.feature_map = v_init<feature>();
  GD::foreach_feature<features_and_source, uint64_t, vec_store>(all, *ec, fs);

  feature_map_len = fs.feature_map.size();
  return fs.feature_map.begin();
}